

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# striped_unwind.c
# Opt level: O0

int * parasail_striped_unwind_32(int lena,int lenb,int segWidth,void *array_)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int32_t i_unwound;
  int32_t column_len;
  int32_t segLen;
  int32_t *array;
  int *ret;
  int j;
  int i;
  void *array__local;
  int segWidth_local;
  int lenb_local;
  int lena_local;
  
  piVar4 = (int *)malloc((long)lena * 4 * (long)lenb);
  iVar1 = (lena + segWidth + -1) / segWidth;
  iVar2 = iVar1 * segWidth;
  for (ret._0_4_ = 0; (int)ret < lenb; ret._0_4_ = (int)ret + 1) {
    for (ret._4_4_ = 0; ret._4_4_ < iVar2; ret._4_4_ = ret._4_4_ + 1) {
      iVar3 = ret._4_4_ / segWidth + (ret._4_4_ % segWidth) * iVar1;
      if (iVar3 < lena) {
        piVar4[iVar3 * lenb + (int)ret] =
             *(int *)((long)array_ + (long)((int)ret * iVar2 + ret._4_4_) * 4);
      }
    }
  }
  return piVar4;
}

Assistant:

static inline int* CONCAT(parasail_striped_unwind_, T) (
        int lena,
        int lenb,
        int segWidth,
        void *array_)
{
    int i;
    int j;
    int *ret = (int*)malloc(sizeof(int)*lena*lenb);
    D *array = (D*)array_;
    const int32_t segLen = (lena + segWidth - 1) / segWidth;
    int32_t column_len = segLen * segWidth;
    for (j=0; j<lenb; ++j) {
        for (i=0; i<column_len; ++i) {
            int32_t i_unwound = i / segWidth + i % segWidth * segLen;
            if (i_unwound < lena) {
                ret[i_unwound*lenb + j] = (int)array[j*column_len + i];
            }
        }
    }
    return ret;
}